

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KmerCounter.cc
# Opt level: O3

ssize_t __thiscall KmerCounter::write(KmerCounter *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  uint64_t count;
  ofstream count_file;
  long *local_240 [2];
  long local_230 [2];
  long *local_220;
  long *local_218;
  long local_210 [29];
  ios_base local_128 [264];
  
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_220,pcVar1,pcVar1 + (this->name)._M_string_length);
  std::__cxx11::string::append((char *)&local_220);
  local_240[0] = local_218;
  std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),(long)local_240);
  std::ostream::write((char *)CONCAT44(in_register_00000034,__fd),(long)local_220);
  if (local_220 != local_210) {
    operator_delete(local_220,local_210[0] + 1);
  }
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (this->name)._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ofstream::ofstream(&local_220,(string *)local_240,_S_out);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  write_counts(this,(ofstream *)&local_220);
  local_220 = _VTT;
  *(undefined8 *)((long)&local_220 + _VTT[-3]) = _setbuf;
  std::filebuf::~filebuf((filebuf *)&local_218);
  sVar2 = std::ios_base::~ios_base(local_128);
  return sVar2;
}

Assistant:

void KmerCounter::write(std::ofstream &output_file) const {
    sdglib::write_string(output_file, name+".sdgkc");
    std::ofstream count_file(name+".sdgkc");
    write_counts(count_file);
}